

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isPossiblePortConnection(TokenKind kind)

{
  bool bVar1;
  
  if (((ushort)(kind - 0x12) < 0xb) && ((0x701U >> (kind - 0x12 & 0x1f) & 1) != 0)) {
    return true;
  }
  bVar1 = isPossibleArgument(kind);
  return bVar1;
}

Assistant:

bool SyntaxFacts::isPossiblePortConnection(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenParenthesisStar:
        case TokenKind::DotStar:
        case TokenKind::Dot:
        case TokenKind::Comma:
            return true;
        default:
            return isPossibleArgument(kind);
    }
}